

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong local_80;
  string *local_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = replaceThis;
  local_80 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  if (local_80 != 0xffffffffffffffff) {
    uVar5 = local_80;
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      plVar1 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(withThis->_M_dataplus)._M_p);
      puVar4 = (ulong *)(plVar1 + 2);
      if ((ulong *)*plVar1 == puVar4) {
        local_90 = *puVar4;
        lStack_88 = plVar1[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *puVar4;
        local_a0 = (ulong *)*plVar1;
      }
      local_98 = plVar1[1];
      *plVar1 = (long)puVar4;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)str);
      uVar3 = 0xf;
      if (local_a0 != &local_90) {
        uVar3 = local_90;
      }
      if (uVar3 < (ulong)(local_b8 + local_98)) {
        uVar3 = 0xf;
        if (local_c0 != local_b0) {
          uVar3 = local_b0[0];
        }
        if (uVar3 < (ulong)(local_b8 + local_98)) goto LAB_0013c402;
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
      }
      else {
LAB_0013c402:
        puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
      }
      plVar1 = puVar2 + 2;
      if ((long *)*puVar2 == plVar1) {
        local_60 = *plVar1;
        uStack_58 = puVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar1;
        local_70 = (long *)*puVar2;
      }
      local_68 = puVar2[1];
      *puVar2 = plVar1;
      puVar2[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::operator=((string *)str,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_c0 != local_b0) {
        operator_delete(local_c0,local_b0[0] + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar3 = 0xffffffffffffffff;
      if (uVar5 < str->_M_string_length - withThis->_M_string_length) {
        uVar3 = std::__cxx11::string::find
                          ((char *)str,(ulong)(local_78->_M_dataplus)._M_p,
                           withThis->_M_string_length + uVar5);
      }
      uVar5 = uVar3;
    } while (uVar3 != 0xffffffffffffffff);
  }
  return local_80 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }